

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O0

int __thiscall ncnn::ConvolutionDepthWise::load_model(ConvolutionDepthWise *this,ModelBin *mb)

{
  float fVar1;
  value_type pLVar2;
  int iVar3;
  bool bVar4;
  size_type sVar5;
  reference ppLVar6;
  float *pfVar7;
  Option *pOVar8;
  Layer *pLVar9;
  undefined8 *in_RSI;
  long in_RDI;
  Mat weights [1];
  ParamDict pd_2;
  float top_rescale;
  int g_2;
  ParamDict pd_1;
  int g_1;
  Mat int8_weight_data_g;
  Mat weight_data_g;
  Option opt;
  ParamDict pd;
  Layer *op;
  int g;
  int weight_data_size_g;
  Mat int8_weight_data;
  bool weight_data_is_float32;
  bool weight_data_is_int8;
  int i_1;
  int i;
  float bottom_blob_int8_scale;
  float weight_data_int8_scale;
  undefined4 in_stack_ffffffffffffec08;
  int in_stack_ffffffffffffec0c;
  int in_stack_ffffffffffffec10;
  int in_stack_ffffffffffffec14;
  undefined4 in_stack_ffffffffffffec18;
  float in_stack_ffffffffffffec1c;
  ParamDict *in_stack_ffffffffffffec20;
  size_type in_stack_ffffffffffffec28;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *in_stack_ffffffffffffec30;
  undefined1 *local_13b8;
  ParamDict *in_stack_ffffffffffffec60;
  ParamDict *local_1390;
  undefined1 local_12b0 [72];
  undefined1 local_1268 [1360];
  float local_d18;
  int local_d14;
  ParamDict local_d10;
  int local_7fc;
  undefined1 local_7f8 [56];
  undefined1 local_7c0 [56];
  undefined8 local_788;
  undefined8 uStack_780;
  Allocator *local_778;
  ParamDict local_768;
  Layer *local_258;
  int local_24c;
  int local_248;
  int local_244;
  undefined8 local_228;
  undefined1 local_202;
  undefined1 local_201;
  int local_200;
  int local_1fc;
  float local_1bc;
  float local_17c;
  undefined1 local_178 [56];
  undefined1 local_140 [56];
  undefined1 local_108 [56];
  undefined1 local_d0 [56];
  undefined1 local_98 [72];
  undefined1 local_50 [56];
  undefined8 *local_18;
  int local_4;
  
  local_18 = in_RSI;
  (**(code **)*in_RSI)(local_50,in_RSI,*(undefined4 *)(in_RDI + 0xa8),0);
  Mat::operator=((Mat *)CONCAT44(in_stack_ffffffffffffec1c,in_stack_ffffffffffffec18),
                 (Mat *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10));
  Mat::~Mat((Mat *)0x16228a);
  bVar4 = Mat::empty((Mat *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10));
  if (bVar4) {
    local_4 = -100;
  }
  else {
    if (*(int *)(in_RDI + 0xa4) != 0) {
      (**(code **)*local_18)(local_98,local_18,*(undefined4 *)(in_RDI + 0x80),1);
      Mat::operator=((Mat *)CONCAT44(in_stack_ffffffffffffec1c,in_stack_ffffffffffffec18),
                     (Mat *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10));
      Mat::~Mat((Mat *)0x16234d);
      bVar4 = Mat::empty((Mat *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10));
      if (bVar4) {
        return -100;
      }
    }
    if (*(int *)(in_RDI + 0xb0) == 1) {
      (**(code **)*local_18)(local_d0,local_18,*(undefined4 *)(in_RDI + 0xac),1);
      Mat::operator=((Mat *)CONCAT44(in_stack_ffffffffffffec1c,in_stack_ffffffffffffec18),
                     (Mat *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10));
      Mat::~Mat((Mat *)0x162412);
      (**(code **)*local_18)(local_108,local_18,*(undefined4 *)(in_RDI + 0xac),1);
      Mat::operator=((Mat *)CONCAT44(in_stack_ffffffffffffec1c,in_stack_ffffffffffffec18),
                     (Mat *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10));
      Mat::~Mat((Mat *)0x162470);
    }
    else if (*(int *)(in_RDI + 0xb0) == 2) {
      (**(code **)*local_18)(local_140,local_18,1);
      Mat::operator=((Mat *)CONCAT44(in_stack_ffffffffffffec1c,in_stack_ffffffffffffec18),
                     (Mat *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10));
      Mat::~Mat((Mat *)0x162528);
      (**(code **)*local_18)(local_178,local_18,1);
      Mat::operator=((Mat *)CONCAT44(in_stack_ffffffffffffec1c,in_stack_ffffffffffffec18),
                     (Mat *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10));
      Mat::~Mat((Mat *)0x16257a);
      pfVar7 = Mat::operator[]((Mat *)(in_RDI + 0x128),0);
      local_17c = *pfVar7;
      Mat::Mat((Mat *)in_stack_ffffffffffffec20,(int)in_stack_ffffffffffffec1c,
               CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
               (Allocator *)CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08));
      Mat::operator=((Mat *)CONCAT44(in_stack_ffffffffffffec1c,in_stack_ffffffffffffec18),
                     (Mat *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10));
      Mat::~Mat((Mat *)0x162604);
      Mat::fill((Mat *)in_stack_ffffffffffffec20,in_stack_ffffffffffffec1c);
      pfVar7 = Mat::operator[]((Mat *)(in_RDI + 0x160),0);
      local_1bc = *pfVar7;
      Mat::Mat((Mat *)in_stack_ffffffffffffec20,(int)in_stack_ffffffffffffec1c,
               CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
               (Allocator *)CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08));
      Mat::operator=((Mat *)CONCAT44(in_stack_ffffffffffffec1c,in_stack_ffffffffffffec18),
                     (Mat *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10));
      Mat::~Mat((Mat *)0x1626ab);
      Mat::fill((Mat *)in_stack_ffffffffffffec20,in_stack_ffffffffffffec1c);
    }
    for (local_1fc = 0; iVar3 = local_1fc,
        sVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                          ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x1a0)
                          ), iVar3 < (int)sVar5; local_1fc = local_1fc + 1) {
      ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x1a0)
                           ,(long)local_1fc);
      if (*ppLVar6 != (value_type)0x0) {
        (*(*ppLVar6)->_vptr_Layer[1])();
      }
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::clear
              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)0x162806);
    for (local_200 = 0; iVar3 = local_200,
        sVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                          ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x1b8)
                          ), iVar3 < (int)sVar5; local_200 = local_200 + 1) {
      ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x1b8)
                           ,(long)local_200);
      if (*ppLVar6 != (value_type)0x0) {
        (*(*ppLVar6)->_vptr_Layer[1])();
      }
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::clear
              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)0x1628a5);
    local_201 = *(long *)(in_RDI + 200) == 1;
    local_202 = *(long *)(in_RDI + 200) == 4;
    if (((bool)local_201) && ((*(byte *)(in_RDI + 0x198) & 1) == 0)) {
      fprintf(_stderr,"quantized int8 weight loaded but use_int8_inference disabled\n");
      local_4 = -1;
    }
    else {
      if (((bool)local_202) && ((*(byte *)(in_RDI + 0x198) & 1) != 0)) {
        Mat::Mat((Mat *)in_stack_ffffffffffffec20,(int)in_stack_ffffffffffffec1c,
                 CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
                 (Allocator *)CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08));
        bVar4 = Mat::empty((Mat *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10));
        if (bVar4) {
          local_4 = -100;
          local_244 = 1;
        }
        else {
          local_248 = *(int *)(in_RDI + 0xa8) / *(int *)(in_RDI + 0xac);
          for (local_24c = 0; local_24c < *(int *)(in_RDI + 0xac); local_24c = local_24c + 1) {
            local_258 = create_layer(in_stack_ffffffffffffec0c);
            ParamDict::ParamDict(in_stack_ffffffffffffec60);
            pfVar7 = Mat::operator[]((Mat *)(in_RDI + 0x128),local_24c);
            ParamDict::set(&local_768,0,*pfVar7);
            (*local_258->_vptr_Layer[2])(local_258,&local_768);
            pOVar8 = get_default_option();
            local_778 = pOVar8->workspace_allocator;
            local_788._0_1_ = pOVar8->lightmode;
            local_788._1_3_ = *(undefined3 *)&pOVar8->field_0x1;
            local_788._4_4_ = pOVar8->num_threads;
            uStack_780 = local_228;
            Mat::range((Mat *)CONCAT44(in_stack_ffffffffffffec1c,in_stack_ffffffffffffec18),
                       in_stack_ffffffffffffec14,in_stack_ffffffffffffec10);
            Mat::range((Mat *)CONCAT44(in_stack_ffffffffffffec1c,in_stack_ffffffffffffec18),
                       in_stack_ffffffffffffec14,in_stack_ffffffffffffec10);
            (*local_258->_vptr_Layer[5])(local_258,local_7c0,local_7f8,&local_788);
            if (local_258 != (Layer *)0x0) {
              (*local_258->_vptr_Layer[1])();
            }
            Mat::~Mat((Mat *)0x162b86);
            Mat::~Mat((Mat *)0x162b93);
            ParamDict::~ParamDict(in_stack_ffffffffffffec20);
          }
          Mat::operator=((Mat *)CONCAT44(in_stack_ffffffffffffec1c,in_stack_ffffffffffffec18),
                         (Mat *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10));
          local_244 = 0;
        }
        Mat::~Mat((Mat *)0x162c55);
        if (local_244 != 0) {
          return local_4;
        }
      }
      if ((*(byte *)(in_RDI + 0x198) & 1) != 0) {
        std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                  (in_stack_ffffffffffffec30,in_stack_ffffffffffffec28);
        std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                  (in_stack_ffffffffffffec30,in_stack_ffffffffffffec28);
        for (local_7fc = 0; local_7fc < *(int *)(in_RDI + 0xac); local_7fc = local_7fc + 1) {
          pLVar9 = create_layer(in_stack_ffffffffffffec0c);
          ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                               (in_RDI + 0x1a0),(long)local_7fc);
          *ppLVar6 = pLVar9;
          ParamDict::ParamDict(in_stack_ffffffffffffec60);
          pfVar7 = Mat::operator[]((Mat *)(in_RDI + 0x160),local_7fc);
          ParamDict::set(&local_d10,0,*pfVar7);
          ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                               (in_RDI + 0x1a0),(long)local_7fc);
          (*(*ppLVar6)->_vptr_Layer[2])(*ppLVar6,&local_d10);
          ParamDict::~ParamDict(in_stack_ffffffffffffec20);
        }
        for (local_d14 = 0; local_d14 < *(int *)(in_RDI + 0xac); local_d14 = local_d14 + 1) {
          pLVar9 = create_layer(in_stack_ffffffffffffec0c);
          ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                               (in_RDI + 0x1b8),(long)local_d14);
          *ppLVar6 = pLVar9;
          pfVar7 = Mat::operator[]((Mat *)(in_RDI + 0x160),local_d14);
          fVar1 = *pfVar7;
          pfVar7 = Mat::operator[]((Mat *)(in_RDI + 0x128),local_d14);
          local_d18 = 1.0 / (fVar1 * *pfVar7);
          ParamDict::ParamDict(in_stack_ffffffffffffec60);
          ParamDict::set((ParamDict *)(local_1268 + 0x40),0,local_d18);
          ParamDict::set((ParamDict *)(local_1268 + 0x40),1,*(int *)(in_RDI + 0xa4));
          ParamDict::set((ParamDict *)(local_1268 + 0x40),2,1);
          ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                               (in_RDI + 0x1b8),(long)local_d14);
          (*(*ppLVar6)->_vptr_Layer[2])(*ppLVar6,local_1268 + 0x40);
          in_stack_ffffffffffffec60 = (ParamDict *)local_1268;
          local_1390 = in_stack_ffffffffffffec60;
          do {
            Mat::Mat((Mat *)local_1390);
            local_1390 = (ParamDict *)&local_1390->params[0].v.dims;
          } while (local_1390 != (ParamDict *)(local_1268 + 0x38));
          Mat::range((Mat *)CONCAT44(in_stack_ffffffffffffec1c,in_stack_ffffffffffffec18),
                     in_stack_ffffffffffffec14,in_stack_ffffffffffffec10);
          Mat::operator=((Mat *)CONCAT44(in_stack_ffffffffffffec1c,in_stack_ffffffffffffec18),
                         (Mat *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10));
          Mat::~Mat((Mat *)0x162fe2);
          ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                               (in_RDI + 0x1b8),(long)local_d14);
          pLVar2 = *ppLVar6;
          ModelBinFromMatArray::ModelBinFromMatArray
                    ((ModelBinFromMatArray *)
                     CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
                     (Mat *)CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08));
          (*pLVar2->_vptr_Layer[3])(pLVar2,local_12b0);
          local_13b8 = local_1268 + 0x38;
          do {
            local_13b8 = local_13b8 + -0x38;
            Mat::~Mat((Mat *)0x16305e);
          } while (local_13b8 != local_1268);
          ParamDict::~ParamDict(in_stack_ffffffffffffec20);
        }
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int ConvolutionDepthWise::load_model(const ModelBin& mb)
{
    weight_data = mb.load(weight_data_size, 0);
    if (weight_data.empty())
        return -100;

    if (bias_term)
    {
        bias_data = mb.load(num_output, 1);
        if (bias_data.empty())
            return -100;
    }

    if (int8_scale_term == 1)
    {
        weight_data_int8_scales = mb.load(group, 1);
        bottom_blob_int8_scales = mb.load(group, 1);
    }
    else if (int8_scale_term == 2)
    {
        weight_data_int8_scales = mb.load(1, 1);
        bottom_blob_int8_scales = mb.load(1, 1);

        // extend group if only one provided
        float weight_data_int8_scale = weight_data_int8_scales[0];
        weight_data_int8_scales = Mat(group);
        weight_data_int8_scales.fill(weight_data_int8_scale);

        float bottom_blob_int8_scale = bottom_blob_int8_scales[0];
        bottom_blob_int8_scales = Mat(group);
        bottom_blob_int8_scales.fill(bottom_blob_int8_scale);
    }

    for (int i=0; i<(int)quantize_ops.size(); i++)
        delete quantize_ops[i];

    quantize_ops.clear();

    for (int i=0; i<(int)dequantize_ops.size(); i++)
        delete dequantize_ops[i];

    dequantize_ops.clear();

    bool weight_data_is_int8 = (weight_data.elemsize == (size_t)1u);
    bool weight_data_is_float32 = (weight_data.elemsize == (size_t)4u);

    if (weight_data_is_int8 && !use_int8_inference)
    {
        fprintf(stderr, "quantized int8 weight loaded but use_int8_inference disabled\n");
        return -1;
    }

    if (weight_data_is_float32 && use_int8_inference)
    {
        // quantize weight to int8
        Mat int8_weight_data(weight_data_size, (size_t)1u);
        if (int8_weight_data.empty())
            return -100;

        const int weight_data_size_g = weight_data_size / group;

        for (int g=0; g<group; g++)
        {
            Layer* op = ncnn::create_layer(ncnn::LayerType::Quantize);

            ncnn::ParamDict pd;
            pd.set(0, weight_data_int8_scales[g]);// scale

            op->load_param(pd);

            ncnn::Option opt = ncnn::get_default_option();
            opt.blob_allocator = int8_weight_data.allocator;

            const Mat weight_data_g = weight_data.range(weight_data_size_g * g, weight_data_size_g);
            Mat int8_weight_data_g = int8_weight_data.range(weight_data_size_g * g, weight_data_size_g);
            op->forward(weight_data_g, int8_weight_data_g, opt);

            delete op;
        }

        weight_data = int8_weight_data;
    }

    if (use_int8_inference)
    {
        quantize_ops.resize(group);
        dequantize_ops.resize(group);

        for (int g=0; g<group; g++)
        {
            quantize_ops[g] = ncnn::create_layer(ncnn::LayerType::Quantize);

            ncnn::ParamDict pd;
            pd.set(0, bottom_blob_int8_scales[g]);// scale

            quantize_ops[g]->load_param(pd);
        }

        for (int g=0; g<group; g++)
        {
            dequantize_ops[g] = ncnn::create_layer(ncnn::LayerType::Dequantize);

            float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

            ncnn::ParamDict pd;
            pd.set(0, top_rescale);// scale
            pd.set(1, bias_term);// bias_term
            pd.set(2, 1);// bias_data_size

            dequantize_ops[g]->load_param(pd);

            ncnn::Mat weights[1];
            weights[0] = bias_data.range(g, 1);

            dequantize_ops[g]->load_model(ModelBinFromMatArray(weights));
        }
    }

    return 0;
}